

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

int Fl_Shared_Image::compare(Fl_Shared_Image **i0,Fl_Shared_Image **i1)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  int i;
  Fl_Shared_Image **i1_local;
  Fl_Shared_Image **i0_local;
  
  __s1 = name(*i0);
  __s2 = name(*i1);
  i0_local._4_4_ = strcmp(__s1,__s2);
  if (i0_local._4_4_ == 0) {
    iVar1 = Fl_Image::w(&(*i0)->super_Fl_Image);
    if (((iVar1 == 0) && ((*i1)->original_ != 0)) ||
       ((iVar1 = Fl_Image::w(&(*i1)->super_Fl_Image), iVar1 == 0 && ((*i0)->original_ != 0)))) {
      i0_local._4_4_ = 0;
    }
    else {
      iVar1 = Fl_Image::w(&(*i0)->super_Fl_Image);
      iVar2 = Fl_Image::w(&(*i1)->super_Fl_Image);
      if (iVar1 == iVar2) {
        iVar1 = Fl_Image::h(&(*i0)->super_Fl_Image);
        iVar2 = Fl_Image::h(&(*i1)->super_Fl_Image);
        i0_local._4_4_ = iVar1 - iVar2;
      }
      else {
        iVar1 = Fl_Image::w(&(*i0)->super_Fl_Image);
        iVar2 = Fl_Image::w(&(*i1)->super_Fl_Image);
        i0_local._4_4_ = iVar1 - iVar2;
      }
    }
  }
  return i0_local._4_4_;
}

Assistant:

int
Fl_Shared_Image::compare(Fl_Shared_Image **i0,		// I - First image
                         Fl_Shared_Image **i1) {	// I - Second image
  int i = strcmp((*i0)->name(), (*i1)->name());

  if (i) return i;
  else if (((*i0)->w() == 0 && (*i1)->original_) ||
           ((*i1)->w() == 0 && (*i0)->original_)) return 0;
  else if ((*i0)->w() != (*i1)->w()) return (*i0)->w() - (*i1)->w();
  else return (*i0)->h() - (*i1)->h();
}